

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellReissner4::LoadableGetStateBlock_x(ChElementShellReissner4 *this)

{
  ChState *in_RDX;
  int in_ESI;
  
  LoadableGetStateBlock_x
            ((ChElementShellReissner4 *)
             ((this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
              _vptr_ChElementBase[-6] +
             (long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                    _vptr_ChElementBase),in_ESI,in_RDX);
  return;
}

Assistant:

void ChElementShellReissner4::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = m_nodes[0]->GetPos().eigen();
    mD.segment(block_offset + 3, 4) = m_nodes[0]->GetRot().eigen();
    mD.segment(block_offset + 7, 3) = m_nodes[1]->GetPos().eigen();
    mD.segment(block_offset + 10, 4) = m_nodes[1]->GetRot().eigen();
    mD.segment(block_offset + 14, 3) = m_nodes[2]->GetPos().eigen();
    mD.segment(block_offset + 17, 4) = m_nodes[2]->GetRot().eigen();
    mD.segment(block_offset + 21, 3) = m_nodes[3]->GetPos().eigen();
    mD.segment(block_offset + 24, 4) = m_nodes[3]->GetRot().eigen();
}